

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O1

void serialization::unserialize_helper<serialization::xml_iarchive,int>
               (xml_iarchive *ar,vector<int,_std::allocator<int>_> *v)

{
  iterator __position;
  size_type sVar1;
  size_type i;
  int tmp;
  int local_2c;
  
  sVar1 = xml_iarchive::load_sequence_start(ar);
  std::vector<int,_std::allocator<int>_>::reserve(v,(ulong)sVar1);
  if (sVar1 != 0) {
    i = 0;
    do {
      xml_iarchive::load_sequence_item_start(ar,i);
      xml_iarchive::load<int>(ar,&local_2c);
      __position._M_current =
           (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(v,__position,&local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
             = __position._M_current + 1;
      }
      xml_iarchive::load_sequence_item_end(ar);
      i = i + 1;
    } while (sVar1 != i);
  }
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}